

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoVDB.h
# Opt level: O3

ValueType * __thiscall
nanovdb::
InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>
::getValueAndCache<nanovdb::ReadAccessor<float,0,1,2>>
          (InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>
           *this,CoordType *ijk,ReadAccessor<float,_0,_1,_2> *acc)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ValueType *pVVar4;
  
  uVar2 = ((uint)ijk->mVec[1] >> 2 & 0x3e0) + (ijk->mVec[0] & 0xf80U) * 8;
  uVar3 = (ulong)((uint)ijk->mVec[2] >> 7 & 0x1f | uVar2);
  if ((*(ulong *)(this + (ulong)(uVar2 >> 6) * 8 + 0x1020) >> (uVar3 & 0x3f) & 1) != 0) {
    iVar1 = *(int *)(this + 0x18);
    uVar2 = *(uint *)(this + uVar3 * 4 + 0x2040);
    (acc->mKey).mVec[2] = ijk->mVec[2];
    *(undefined8 *)(acc->mKey).mVec = *(undefined8 *)ijk->mVec;
    acc->mNode[1] =
         (InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u> *)
         (this + (ulong)uVar2 * 0x4440 + (long)iVar1 * 0x22040);
    pVVar4 = InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>::
             getValueAndCache<nanovdb::ReadAccessor<float,0,1,2>>
                       ((InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u> *
                        )(this + (ulong)uVar2 * 0x4440 + (long)iVar1 * 0x22040),ijk,acc);
    return pVVar4;
  }
  return (ValueType *)(this + uVar3 * 4 + 0x2040);
}

Assistant:

__hostdev__ static uint32_t CoordToOffset(const CoordType& ijk)
    {
        return (((ijk[0] & MASK) >> ChildT::TOTAL) << (2 * LOG2DIM)) +
               (((ijk[1] & MASK) >> ChildT::TOTAL) << (LOG2DIM)) +
               ((ijk[2] & MASK) >> ChildT::TOTAL);
    }